

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::GetCameraAngle(ON_Viewport *this,double *angle)

{
  bool bVar1;
  double angle_w;
  double angle_h;
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = 0.0;
  bVar1 = GetCameraAngle(this,(double *)0x0,&local_10,&local_18);
  if (angle != (double *)0x0 && bVar1) {
    if (local_18 <= local_10) {
      local_10 = local_18;
    }
    *angle = local_10;
  }
  return bVar1;
}

Assistant:

bool ON_Viewport::GetCameraAngle( 
       double* angle
       ) const
{
  double angle_h = 0.0;
  double angle_w = 0.0;
  bool rc = GetCameraAngle( nullptr, &angle_h, &angle_w );
  if ( angle && rc ) {
    *angle = (angle_h < angle_w) ? angle_h : angle_w;
  }
  return rc;
}